

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O1

zip_int64_t read_data(void *state,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  zip_buffer_fragment_t *pzVar1;
  undefined8 uVar2;
  long *plVar3;
  buffer_t *buffer;
  zip_uint64_t zVar4;
  ulong uVar5;
  _Bool _Var6;
  int iVar7;
  zip_uint8_t *pzVar8;
  zip_int64_t zVar9;
  buffer_t *pbVar10;
  zip_uint64_t zVar11;
  buffer_t *pbVar12;
  int se;
  ulong uVar13;
  long lVar14;
  zip_uint64_t zVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    pbVar10 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010ce66;
  case ZIP_SOURCE_READ:
    if (-1 < (long)len) {
      plVar3 = *(long **)((long)state + 0x30);
      uVar13 = plVar3[7] - plVar3[8];
      if (len <= uVar13) {
        uVar13 = len;
      }
      if (uVar13 == 0) {
        return 0;
      }
      lVar17 = plVar3[9];
      lVar14 = plVar3[8] - *(long *)(plVar3[1] + lVar17 * 8);
      uVar16 = 0;
      do {
        lVar19 = lVar17 * 0x10;
        uVar18 = *(long *)(*plVar3 + 8 + lVar19) - lVar14;
        if (uVar13 - uVar16 < uVar18) {
          uVar18 = uVar13 - uVar16;
        }
        memcpy((void *)((long)data + uVar16),(void *)(*(long *)(*plVar3 + lVar19) + lVar14),uVar18);
        lVar17 = (ulong)(uVar18 == *(long *)(*plVar3 + 8 + lVar19) - lVar14) + lVar17;
        uVar16 = uVar18 + uVar16;
        lVar14 = 0;
      } while (uVar16 < uVar13);
      plVar3[8] = plVar3[8] + uVar16;
      plVar3[9] = lVar17;
      return uVar16;
    }
    goto LAB_0010ce78;
  case ZIP_SOURCE_CLOSE:
    break;
  case ZIP_SOURCE_STAT:
    if (0x3f < len) {
      zip_stat_init((zip_stat_t *)data);
      *(undefined8 *)((long)data + 0x28) = *(undefined8 *)((long)state + 0x10);
      uVar2 = *(undefined8 *)(*(long *)((long)state + 0x30) + 0x38);
      *(undefined8 *)((long)data + 0x18) = uVar2;
      *(undefined8 *)((long)data + 0x20) = uVar2;
      *(undefined4 *)((long)data + 0x34) = 0;
      *(undefined8 *)data = 0xdc;
      return 0x40;
    }
    goto LAB_0010ce78;
  case ZIP_SOURCE_ERROR:
    zVar9 = zip_error_to_data((zip_error_t *)state,data,len);
    return zVar9;
  case ZIP_SOURCE_FREE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    buffer_free(*(buffer_t **)((long)state + 0x38));
    free(state);
    break;
  case ZIP_SOURCE_SEEK:
    pbVar10 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010cd8b;
  case ZIP_SOURCE_TELL:
    lVar17 = *(long *)((long)state + 0x30);
    goto LAB_0010cda5;
  case ZIP_SOURCE_BEGIN_WRITE:
    pbVar10 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    *(buffer_t **)((long)state + 0x38) = pbVar10;
    if (pbVar10 == (buffer_t *)0x0) {
      return -1;
    }
LAB_0010ce66:
    pbVar10->offset = 0;
    pbVar10->current_fragment = 0;
    break;
  case ZIP_SOURCE_COMMIT_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)state + 0x38);
    goto LAB_0010ce42;
  case ZIP_SOURCE_ROLLBACK_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x38));
LAB_0010ce42:
    *(undefined8 *)((long)state + 0x38) = 0;
    break;
  case ZIP_SOURCE_WRITE:
    if (-1 < (long)len) {
      pbVar10 = *(buffer_t **)((long)state + 0x38);
      if (len <= -pbVar10->offset - 0x10000) {
        uVar16 = pbVar10->offset + len;
        uVar13 = pbVar10->fragment_offsets[pbVar10->nfragments];
        lVar17 = uVar16 - uVar13;
        if (uVar16 < uVar13 || lVar17 == 0) goto LAB_0010cbf5;
        uVar18 = (lVar17 + 0xffffU >> 0x10) + pbVar10->nfragments;
        uVar16 = pbVar10->fragments_capacity;
        if (uVar16 < uVar18) {
          uVar5 = 0x10;
          if (uVar16 != 0) {
            uVar5 = uVar16;
          }
          do {
            uVar16 = uVar5;
            uVar5 = uVar16 * 2;
          } while (uVar16 < uVar18);
          _Var6 = buffer_grow_fragments(pbVar10,uVar16,(zip_error_t *)state);
          if (!_Var6) {
LAB_0010cf99:
            iVar7 = 0xe;
            goto LAB_0010ce80;
          }
        }
        uVar16 = pbVar10->nfragments;
        if (uVar16 < uVar18) {
          pzVar1 = pbVar10->fragments;
          do {
            uVar13 = uVar13 + 0x10000;
            pzVar8 = (zip_uint8_t *)malloc(0x10000);
            pzVar1[uVar16].data = pzVar8;
            if (pzVar8 == (zip_uint8_t *)0x0) goto LAB_0010cf99;
            pzVar1[uVar16].length = 0x10000;
            pbVar10->nfragments = uVar16 + 1;
            pbVar10->fragment_offsets[uVar16 + 1] = uVar13;
            uVar16 = pbVar10->nfragments;
          } while (uVar16 < uVar18);
        }
LAB_0010cbf5:
        zVar15 = pbVar10->current_fragment;
        if (len == 0) {
          uVar13 = 0;
        }
        else {
          lVar17 = pbVar10->offset - pbVar10->fragment_offsets[zVar15];
          uVar13 = 0;
          do {
            uVar16 = pbVar10->fragments[zVar15].length - lVar17;
            if (len - uVar13 < uVar16) {
              uVar16 = len - uVar13;
            }
            memcpy(pbVar10->fragments[zVar15].data + lVar17,(void *)((long)data + uVar13),uVar16);
            zVar15 = zVar15 + (uVar16 == pbVar10->fragments[zVar15].length - lVar17);
            uVar13 = uVar13 + uVar16;
            lVar17 = 0;
          } while (uVar13 < len);
        }
        uVar16 = pbVar10->offset + uVar13;
        pbVar10->offset = uVar16;
        pbVar10->current_fragment = zVar15;
        if (pbVar10->size < uVar16) {
          pbVar10->size = uVar16;
          return uVar13;
        }
        return uVar13;
      }
    }
    goto LAB_0010ce78;
  case ZIP_SOURCE_SEEK_WRITE:
    pbVar10 = *(buffer_t **)((long)state + 0x38);
LAB_0010cd8b:
    iVar7 = buffer_seek(pbVar10,data,len,(zip_error_t *)state);
    return (long)iVar7;
  case ZIP_SOURCE_TELL_WRITE:
    lVar17 = *(long *)((long)state + 0x38);
LAB_0010cda5:
    if (-1 < *(long *)(lVar17 + 0x40)) {
      return *(long *)(lVar17 + 0x40);
    }
    iVar7 = 0x1e;
    se = 0x4b;
    goto LAB_0010ce82;
  case ZIP_SOURCE_SUPPORTS:
    zVar9 = zip_source_make_command_bitmap
                      (ZIP_SOURCE_GET_FILE_ATTRIBUTES,0,1,2,3,4,5,6,7,8,0x11,9,0xf,10,0xc,0xd,0xb,
                       0xffffffffffffffff);
    return zVar9;
  case ZIP_SOURCE_REMOVE:
    pbVar10 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    if (pbVar10 == (buffer_t *)0x0) {
      return -1;
    }
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(buffer_t **)((long)state + 0x30) = pbVar10;
    break;
  default:
    iVar7 = 0x1c;
    goto LAB_0010ce80;
  case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    if (len == 0) {
      pbVar10 = buffer_new((zip_buffer_fragment_t *)0x0,0,1,(zip_error_t *)state);
    }
    else {
      buffer = *(buffer_t **)((long)state + 0x30);
      if (buffer->size < len) {
        iVar7 = 0x12;
      }
      else if (buffer->shared_buffer == (buffer *)0x0) {
        zVar11 = buffer_find_fragment(buffer,len);
        zVar15 = len - buffer->fragment_offsets[zVar11];
        if (zVar15 == 0) {
          zVar11 = zVar11 - 1;
          zVar15 = buffer->fragments[zVar11].length;
        }
        if (buffer->fragments[zVar11].length - zVar15 <= len) {
          pbVar12 = buffer_new(buffer->fragments,zVar11 + 1,0,(zip_error_t *)state);
          pbVar10 = (buffer_t *)0x0;
          if (pbVar12 != (buffer_t *)0x0) {
            zVar4 = pbVar12->nfragments;
            pbVar12->fragments[zVar4 - 1].length = zVar15;
            pbVar12->fragment_offsets[zVar4] = len;
            pbVar12->size = len;
            zVar15 = pbVar12->nfragments;
            uVar13 = zVar15 - 1;
            if (buffer->first_owned_fragment < uVar13) {
              uVar13 = buffer->first_owned_fragment;
            }
            pbVar12->first_owned_fragment = uVar13;
            buffer->shared_buffer = pbVar12;
            pbVar12->shared_buffer = buffer;
            buffer->shared_fragments = zVar15;
            pbVar12->shared_fragments = zVar11 + 1;
            pbVar10 = pbVar12;
          }
          goto LAB_0010cf4d;
        }
        iVar7 = 0x1c;
      }
      else {
        iVar7 = 0x1d;
      }
      zip_error_set((zip_error_t *)state,iVar7,0);
      pbVar10 = (buffer_t *)0x0;
    }
LAB_0010cf4d:
    *(buffer_t **)((long)state + 0x38) = pbVar10;
    if (pbVar10 == (buffer_t *)0x0) {
      return -1;
    }
    pbVar10->offset = len;
    pbVar10->current_fragment = pbVar10->nfragments;
    return 0;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (0x17 < len) {
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)state + 0x28);
      uVar2 = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)data = *(undefined8 *)((long)state + 0x18);
      *(undefined8 *)((long)data + 8) = uVar2;
      return 0x18;
    }
LAB_0010ce78:
    iVar7 = 0x12;
LAB_0010ce80:
    se = 0;
LAB_0010ce82:
    zip_error_set((zip_error_t *)state,iVar7,se);
    return -1;
  }
  return 0;
}

Assistant:

static zip_int64_t
read_data(void *state, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct read_data *ctx = (struct read_data *)state;

    switch (cmd) {
    case ZIP_SOURCE_BEGIN_WRITE:
	if ((ctx->out = buffer_new(NULL, 0, 0, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = 0;
	ctx->out->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_BEGIN_WRITE_CLONING:
	if ((ctx->out = buffer_clone(ctx->in, len, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = len;
	ctx->out->current_fragment = ctx->out->nfragments;
	return 0;

    case ZIP_SOURCE_CLOSE:
	return 0;

    case ZIP_SOURCE_COMMIT_WRITE:
	buffer_free(ctx->in);
	ctx->in = ctx->out;
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_ERROR:
	return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
	buffer_free(ctx->in);
	buffer_free(ctx->out);
	free(ctx);
	return 0;

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES: {
	if (len < sizeof(ctx->attributes)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	memcpy(data, &ctx->attributes, sizeof(ctx->attributes));

	return sizeof(ctx->attributes);
    }

    case ZIP_SOURCE_OPEN:
	ctx->in->offset = 0;
	ctx->in->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_READ:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_read(ctx->in, data, len);

    case ZIP_SOURCE_REMOVE: {
	buffer_t *empty = buffer_new(NULL, 0, 0, &ctx->error);
	if (empty == NULL) {
	    return -1;
	}

	buffer_free(ctx->in);
	ctx->in = empty;
	return 0;
    }

    case ZIP_SOURCE_ROLLBACK_WRITE:
	buffer_free(ctx->out);
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_SEEK:
	return buffer_seek(ctx->in, data, len, &ctx->error);

    case ZIP_SOURCE_SEEK_WRITE:
	return buffer_seek(ctx->out, data, len, &ctx->error);

    case ZIP_SOURCE_STAT: {
	zip_stat_t *st;

	if (len < sizeof(*st)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	st = (zip_stat_t *)data;

	zip_stat_init(st);
	st->mtime = ctx->mtime;
	st->size = ctx->in->size;
	st->comp_size = st->size;
	st->comp_method = ZIP_CM_STORE;
	st->encryption_method = ZIP_EM_NONE;
	st->valid = ZIP_STAT_MTIME | ZIP_STAT_SIZE | ZIP_STAT_COMP_SIZE | ZIP_STAT_COMP_METHOD | ZIP_STAT_ENCRYPTION_METHOD;

	return sizeof(*st);
    }

    case ZIP_SOURCE_SUPPORTS:
	return zip_source_make_command_bitmap(ZIP_SOURCE_GET_FILE_ATTRIBUTES, ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_SEEK, ZIP_SOURCE_TELL, ZIP_SOURCE_BEGIN_WRITE, ZIP_SOURCE_BEGIN_WRITE_CLONING, ZIP_SOURCE_COMMIT_WRITE, ZIP_SOURCE_REMOVE, ZIP_SOURCE_ROLLBACK_WRITE, ZIP_SOURCE_SEEK_WRITE, ZIP_SOURCE_TELL_WRITE, ZIP_SOURCE_WRITE, -1);

    case ZIP_SOURCE_TELL:
	if (ctx->in->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->in->offset;


    case ZIP_SOURCE_TELL_WRITE:
	if (ctx->out->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->out->offset;

    case ZIP_SOURCE_WRITE:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_write(ctx->out, data, len, &ctx->error);

    default:
	zip_error_set(&ctx->error, ZIP_ER_OPNOTSUPP, 0);
	return -1;
    }
}